

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcErrorList.cpp
# Opt level: O2

void WriteTableDescriptionString(ostream *strmOut,TableId ti)

{
  fontTableId32 fVar1;
  int fxdVersion;
  ostream *poVar2;
  double dVar3;
  char csTagStr [8];
  char local_48;
  undefined1 local_47;
  undefined1 local_46;
  undefined1 local_45;
  undefined1 local_44;
  undefined2 local_43;
  undefined1 local_41;
  string local_40;
  
  fVar1 = TtfUtil::TableIdTag(ti);
  local_48 = ' ';
  local_47 = (undefined1)(fVar1 >> 0x18);
  local_46 = (undefined1)(fVar1 >> 0x10);
  local_45 = (undefined1)(fVar1 >> 8);
  local_44 = (undefined1)fVar1;
  local_43 = 0x203a;
  local_41 = 0;
  dVar3 = GrcManager::CompressionRatio(&g_cman,ti);
  poVar2 = std::operator<<(strmOut,&local_48);
  fxdVersion = GrcManager::TableVersion(&g_cman,ti);
  VersionString_abi_cxx11_(&local_40,fxdVersion);
  std::operator<<(poVar2,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    poVar2 = std::operator<<(strmOut," compressed (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)(100.0 / (dVar3 + 1.0)));
    std::operator<<(poVar2,"% of original)");
  }
  std::endl<char,std::char_traits<char>>(strmOut);
  return;
}

Assistant:

void WriteTableDescriptionString(std::ostream& strmOut, TableId ti)
{
    uint32 nTag = TtfUtil::TableIdTag(ti);
    char csTagStr[] = {' ', (char)(nTag >> 24), (char)(nTag >> 16), (char)(nTag >> 8), (char)nTag, ':', ' ', 0 };
    double dCompressionRatio = g_cman.CompressionRatio(ti);
    strmOut << csTagStr << VersionString(g_cman.TableVersion(ti));

    if (dCompressionRatio)
        strmOut << " compressed (" << int(100/(1+dCompressionRatio)) << "% of original)";
    strmOut << std::endl;
}